

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_ech_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  int iVar1;
  undefined8 in_RAX;
  uint8_t type;
  uint8_t local_11;
  
  local_11 = (uint8_t)((ulong)in_RAX >> 0x38);
  if (contents == (CBS *)0x0) {
    return true;
  }
  iVar1 = CBS_get_u8(contents,&local_11);
  if (iVar1 != 0) {
    if (local_11 == '\0') {
      return true;
    }
    if ((local_11 == '\x01') && (contents->len == 0)) {
      hs->field_0x6c8 = hs->field_0x6c8 | 1;
      return true;
    }
  }
  return false;
}

Assistant:

static bool ext_ech_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  if (contents == nullptr) {
    return true;
  }

  uint8_t type;
  if (!CBS_get_u8(contents, &type)) {
    return false;
  }
  if (type == ECH_CLIENT_OUTER) {
    // Outer ECH extensions are handled outside the callback.
    return true;
  }
  if (type != ECH_CLIENT_INNER || CBS_len(contents) != 0) {
    return false;
  }

  hs->ech_is_inner = true;
  return true;
}